

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O0

_Bool concat_tensor(TENSOR *src,TENSOR *dst)

{
  _Bool _Var1;
  int iVar2;
  int *in_RSI;
  long in_RDI;
  int c;
  TENSOR t;
  int newallocsize;
  int channels;
  int dst_channels;
  int in_stack_fffffffffffff7bc;
  int iVar3;
  int in_stack_fffffffffffff7c0;
  int in_stack_fffffffffffff7c4;
  int in_stack_fffffffffffff7c8;
  int in_stack_fffffffffffff7cc;
  TENSOR *in_stack_fffffffffffff7d0;
  TENSOR *in_stack_ffffffffffffffc8;
  TENSOR *in_stack_ffffffffffffffd0;
  
  iVar2 = in_RSI[1] + *(int *)(in_RDI + 4);
  if (*in_RSI < iVar2 * in_RSI[2] * in_RSI[3]) {
    init_tensor((TENSOR *)0x6ee8d9);
    _Var1 = realloc_tensor((TENSOR *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
                           in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0,
                           in_stack_fffffffffffff7bc);
    if (!_Var1) {
      return false;
    }
    copy_tensor(in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8,
                (TENSOR *)CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0));
    swap_tensor(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    free_tensor((TENSOR *)0x6ee94c);
  }
  for (iVar3 = 1; iVar3 < iVar2; iVar3 = iVar3 + 1) {
    *(long *)(in_RSI + (long)iVar3 * 2 + 6) =
         *(long *)(in_RSI + 6) + (long)(iVar3 * in_RSI[2] * in_RSI[3]) * 4;
  }
  copy_tensor(in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8,
              (TENSOR *)CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0));
  return true;
}

Assistant:

static bool concat_tensor(const TENSOR *src, TENSOR *dst) {
  assert(src->width == dst->width);
  assert(src->height == dst->height);

  const int dst_channels = dst->channels;
  const int channels = dst->channels + src->channels;
  const int newallocsize = channels * dst->width * dst->height;
  if (dst->allocsize < newallocsize) {
    TENSOR t;
    init_tensor(&t);
    // allocate new buffers and copy first the dst channels
    if (!realloc_tensor(&t, channels, dst->width, dst->height)) return false;
    copy_tensor(dst, dst->channels, 0, &t);
    // Swap the tensors and free the old buffers
    swap_tensor(dst, &t);
    free_tensor(&t);
  }
  for (int c = 1; c < channels; ++c)
    dst->buf[c] = &dst->buf[0][c * dst->width * dst->height];
  // Copy the channels in src after the first dst_channels channels.
  copy_tensor(src, src->channels, dst_channels, dst);
  return true;
}